

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::Assert::Assert
          (Assert *this,LocationRange *lr,Fodder *open_fodder,AST *cond,Fodder *colon_fodder,
          AST *message,Fodder *semicolon_fodder,AST *rest)

{
  AST *in_RCX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDI;
  LocationRange *in_R8;
  pointer in_R9;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *unaff_retaddr;
  pointer in_stack_00000010;
  Fodder *in_stack_ffffffffffffffc8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_> *__x;
  
  __x = in_RDI;
  AST::AST(in_RCX,in_R8,(ASTType)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffc8);
  (in_RDI->
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Assert_003a0a90;
  in_RDI[5].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RCX;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(unaff_retaddr,__x);
  in_RDI[6].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_R9;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(unaff_retaddr,__x);
  in_RDI[8].
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start = in_stack_00000010;
  return;
}

Assistant:

Assert(const LocationRange &lr, const Fodder &open_fodder, AST *cond,
           const Fodder &colon_fodder, AST *message, const Fodder &semicolon_fodder, AST *rest)
        : AST(lr, AST_ASSERT, open_fodder),
          cond(cond),
          colonFodder(colon_fodder),
          message(message),
          semicolonFodder(semicolon_fodder),
          rest(rest)
    {
    }